

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_dump.h
# Opt level: O1

void __thiscall
phmap::BinaryInputArchive::BinaryInputArchive(BinaryInputArchive *this,char *file_path)

{
  ifstream *this_00;
  anon_class_8_1_8991fb9c local_28;
  
  (this->destruct_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->destruct_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->destruct_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->destruct_).super__Function_base._M_functor + 8) = 0;
  this_00 = (ifstream *)operator_new(0x208);
  std::ifstream::ifstream(this_00,file_path,_S_in|_S_bin);
  this->is_ = (istream *)this_00;
  local_28.this = this;
  std::function<void()>::operator=((function<void()> *)&this->destruct_,&local_28);
  return;
}

Assistant:

BinaryInputArchive(const char * file_path) {
      is_ = new std::ifstream(file_path,
                              std::ifstream::in | std::ifstream::binary);
      destruct_ = [this]() { delete is_; };
    }